

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_user_exception(sexp ctx,sexp self,char *ms,sexp ir)

{
  sexp psVar1;
  sexp message;
  sexp_sint_t n;
  sexp irr;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp str;
  sexp sym;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_80;
  sexp_gc_var_t local_78;
  sexp local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_78.var = &local_60;
  local_60 = (sexp)0x43e;
  local_48.next = &local_78;
  local_48.var = &local_68;
  local_68 = (sexp)0x43e;
  local_58.next = &local_48;
  local_58.var = &local_80;
  local_80 = (sexp)&DAT_0000043e;
  local_78.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_48.next;
  (ctx->value).context.saves = local_58.next;
  (ctx->value).context.saves = &local_58;
  psVar1 = sexp_intern(ctx,"user",-1);
  local_60 = psVar1;
  message = sexp_c_string(ctx,ms,-1);
  local_68 = message;
  if (((ulong)ir & 3) == 0) {
    if ((ir == (sexp)&DAT_0000023e) || (ir->tag == 6)) goto LAB_0010e7fa;
  }
  else if (ir == (sexp)&DAT_0000023e) goto LAB_0010e7fa;
  ir = sexp_cons_op(ctx,(sexp)ms,n,ir,(sexp)&DAT_0000023e);
  local_80 = ir;
LAB_0010e7fa:
  psVar1 = sexp_make_exception(ctx,psVar1,message,ir,self,(sexp)&DAT_0000003e);
  (ctx->value).context.saves = local_78.next;
  return psVar1;
}

Assistant:

sexp sexp_user_exception (sexp ctx, sexp self, const char *ms, sexp ir) {
  sexp res;
  sexp_gc_var3(sym, str, irr);
  sexp_gc_preserve3(ctx, sym, str, irr);
  res = sexp_make_exception(ctx, sym = sexp_intern(ctx, "user", -1),
                            str = sexp_c_string(ctx, ms, -1),
                            ((sexp_pairp(ir) || sexp_nullp(ir))
                             ? ir : (irr = sexp_list1(ctx, ir))),
                            self, SEXP_FALSE);
  sexp_gc_release3(ctx);
  return res;
}